

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O2

void lj_meta_init(lua_State *L)

{
  uint64_t uVar1;
  GCstr *pGVar2;
  ulong uVar3;
  char cVar4;
  char *str;
  size_t lenx;
  
  uVar1 = (L->glref).ptr64;
  str = 
  "__index__newindex__gc__mode__eq__len__lt__le__concat__call__add__sub__mul__div__mod__pow__unm__metatable__tostring__new__pairs__ipairs"
  ;
  uVar3 = 0;
  cVar4 = '_';
  while (cVar4 != '\0') {
    lenx = 2;
    while( true ) {
      cVar4 = str[lenx];
      if ((cVar4 == '\0') || (cVar4 == '_')) break;
      lenx = lenx + 1;
    }
    pGVar2 = lj_str_new(L,str,lenx);
    *(GCstr **)(uVar1 + 0x1a8 + uVar3 * 8) = pGVar2;
    uVar3 = (ulong)((int)uVar3 + 1);
    str = str + lenx;
  }
  return;
}

Assistant:

void lj_meta_init(lua_State *L)
{
#define MMNAME(name)	"__" #name
  const char *metanames = MMDEF(MMNAME);
#undef MMNAME
  global_State *g = G(L);
  const char *p, *q;
  uint32_t mm;
  for (mm = 0, p = metanames; *p; mm++, p = q) {
    GCstr *s;
    for (q = p+2; *q && *q != '_'; q++) ;
    s = lj_str_new(L, p, (size_t)(q-p));
    /* NOBARRIER: g->gcroot[] is a GC root. */
    setgcref(g->gcroot[GCROOT_MMNAME+mm], obj2gco(s));
  }
}